

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::PhraseTests_ExtraPoints_Test::~PhraseTests_ExtraPoints_Test
          (PhraseTests_ExtraPoints_Test *this)

{
  PhraseTests_ExtraPoints_Test *this_local;
  
  ~PhraseTests_ExtraPoints_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PhraseTests, ExtraPoints) {
  auto a = readAlignment("0-0 0-4 2-4 3-3");
  Span src{0, 1};
  auto tgt = minimalTargetSpan(a, src);
  ASSERT_TRUE(tgt.has_value());
  EXPECT_EQ(0, tgt->start);
  EXPECT_EQ(5, tgt->end);
}